

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

ostream * __thiscall wasm::String::printEscapedJSON(String *this,ostream *os,string_view str)

{
  long lVar1;
  _Storage<unsigned_int,_true> _Var2;
  optional<unsigned_int> oVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  undefined1 local_48 [8];
  string_view str_local;
  
  str_local._M_len = str._M_len;
  str_local._M_str._7_1_ = 0x22;
  local_48 = (undefined1  [8])os;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(char *)((long)&str_local._M_str + 7),1);
  if (os != (ostream *)0x0) {
    do {
      oVar3 = anon_unknown_0::takeWTF16CodePoint((string_view *)local_48,true);
      _Var2._M_value =
           oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      switch(_Var2._M_value) {
      case 8:
        lVar5 = 2;
        pcVar6 = "\\b";
        break;
      case 9:
        lVar5 = 2;
        pcVar6 = "\\t";
        break;
      case 10:
        lVar5 = 2;
        pcVar6 = "\\n";
        break;
      case 0xb:
switchD_00c2de61_caseD_b:
        if (_Var2._M_value - 0x20 < 0x5f) {
          str_local._M_str._7_1_ =
               oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload._0_1_;
          lVar5 = 1;
          pcVar6 = (char *)((long)&str_local._M_str + 7);
          break;
        }
        if ((uint)_Var2 < 0x10000) {
          *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) =
               *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\\u",2);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) =
               *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) & 0xffffffb5 | 2;
        }
        else {
          if (0x10ffff < _Var2._M_value) {
            __assert_fail("u <= 0x10FFFF && \"unexpectedly high code point\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/string.cpp"
                          ,0x1a1,
                          "std::ostream &wasm::String::printEscapedJSON(std::ostream &, std::string_view)"
                         );
          }
          *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) =
               *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\\u",2);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          lVar5 = *(long *)this;
          lVar1 = *(long *)(lVar5 + -0x18);
          *(uint *)(this + lVar1 + 0x18) = *(uint *)(this + lVar1 + 0x18) & 0xffffffb5 | 2;
          lVar5 = *(long *)(lVar5 + -0x18);
          *(uint *)(this + lVar5 + 0x18) = *(uint *)(this + lVar5 + 0x18) & 0xffffffb5 | 8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\\u",2);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) =
               *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) & 0xffffffb5 | 2;
        }
        goto LAB_00c2deff;
      case 0xc:
        lVar5 = 2;
        pcVar6 = "\\f";
        break;
      case 0xd:
        lVar5 = 2;
        pcVar6 = "\\r";
        break;
      default:
        if (_Var2._M_value == 0x5c) {
          lVar5 = 2;
          pcVar6 = "\\\\";
        }
        else {
          if (_Var2._M_value != 0x22) goto switchD_00c2de61_caseD_b;
          lVar5 = 2;
          pcVar6 = "\\\"";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,pcVar6,lVar5);
LAB_00c2deff:
    } while (local_48 != (undefined1  [8])0x0);
  }
  str_local._M_str._7_1_ = 0x22;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,(char *)((long)&str_local._M_str + 7),1);
  return poVar4;
}

Assistant:

std::ostream& printEscapedJSON(std::ostream& os, std::string_view str) {
  os << '"';
  while (str.size()) {
    auto u = *takeWTF16CodePoint(str);

    // Use escape sequences mandated by the JSON spec.
    switch (u) {
      case '"':
        os << "\\\"";
        continue;
      case '\\':
        os << "\\\\";
        continue;
      case '\b':
        os << "\\b";
        continue;
      case '\f':
        os << "\\f";
        continue;
      case '\n':
        os << "\\n";
        continue;
      case '\r':
        os << "\\r";
        continue;
      case '\t':
        os << "\\t";
        continue;
      default:
        break;
    }

    // TODO: To minimize size, consider additionally escaping only other control
    // characters (u <= 0x1F) and surrogates, emitting everything else directly
    // assuming a UTF-8 encoding of the JSON text. We don't do this now because
    // Print.cpp would consider the contents unprintable, messing up our test.
    bool isNaivelyPrintable = 32 <= u && u < 127;
    if (isNaivelyPrintable) {
      assert(u < 0x80 && "need additional logic to emit valid UTF-8");
      os << uint8_t(u);
      continue;
    }

    // Escape as '\uXXXX` for code points less than 0x10000 or as a
    // '\uXXXX\uYYYY' surrogate pair otherwise.
    auto printEscape = [&os](uint32_t codePoint) {
      assert(codePoint < 0x10000);
      os << std::hex << "\\u";
      os << ((codePoint & 0xF000) >> 12);
      os << ((codePoint & 0x0F00) >> 8);
      os << ((codePoint & 0x00F0) >> 4);
      os << (codePoint & 0x000F);
      os << std::dec;
    };
    if (u < 0x10000) {
      printEscape(u);
    } else {
      assert(u <= 0x10FFFF && "unexpectedly high code point");
      printEscape(0xD800 + ((u - 0x10000) >> 10));
      printEscape(0xDC00 + ((u - 0x10000) & 0x3FF));
    }
  }
  return os << '"';
}